

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_sse2.c
# Opt level: O0

int32_t xx_mask_and_hadd(__m128i vsum1,__m128i vsum2,int i)

{
  ulong in_XMM0_Qa;
  ulong uVar1;
  ulong uVar2;
  ulong in_XMM0_Qb;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  int iStack_88;
  int iStack_84;
  __m128i vecb;
  __m128i veca;
  int i_local;
  __m128i vsum2_local;
  __m128i vsum1_local;
  
  uVar1 = in_XMM0_Qa & *(ulong *)sse_bytemask_2x4[(int)vsum1[0]][0];
  uVar3 = in_XMM0_Qb & *(ulong *)(sse_bytemask_2x4[(int)vsum1[0]][0] + 2);
  uVar2 = CONCAT44(in_XMM1_Db,in_XMM1_Da) & *(ulong *)sse_bytemask_2x4[(int)vsum1[0]][1];
  uVar4 = CONCAT44(in_XMM1_Dd,in_XMM1_Dc) & *(ulong *)(sse_bytemask_2x4[(int)vsum1[0]][1] + 2);
  vecb[1]._0_4_ = (int)uVar1;
  vecb[1]._4_4_ = (int)(uVar1 >> 0x20);
  veca[0]._0_4_ = (int)uVar3;
  veca[0]._4_4_ = (int)(uVar3 >> 0x20);
  iStack_88 = (int)uVar2;
  iStack_84 = (int)(uVar2 >> 0x20);
  vecb[0]._0_4_ = (int)uVar4;
  vecb[0]._4_4_ = (int)(uVar4 >> 0x20);
  return (int)vecb[1] + iStack_88 + (int)veca[0] + (int)vecb[0] +
         vecb[1]._4_4_ + iStack_84 + veca[0]._4_4_ + vecb[0]._4_4_;
}

Assistant:

static int32_t xx_mask_and_hadd(__m128i vsum1, __m128i vsum2, int i) {
  __m128i veca, vecb;
  // Mask and obtain the required 5 values inside the vector
  veca = _mm_and_si128(vsum1, *(__m128i *)sse_bytemask_2x4[i][0]);
  vecb = _mm_and_si128(vsum2, *(__m128i *)sse_bytemask_2x4[i][1]);
  // A = [A0+B0, A1+B1, A2+B2, A3+B3]
  veca = _mm_add_epi32(veca, vecb);
  // B = [A2+B2, A3+B3, 0, 0]
  vecb = _mm_srli_si128(veca, 8);
  // A = [A0+B0+A2+B2, A1+B1+A3+B3, X, X]
  veca = _mm_add_epi32(veca, vecb);
  // B = [A1+B1+A3+B3, 0, 0, 0]
  vecb = _mm_srli_si128(veca, 4);
  // A = [A0+B0+A2+B2+A1+B1+A3+B3, X, X, X]
  veca = _mm_add_epi32(veca, vecb);
  return _mm_cvtsi128_si32(veca);
}